

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_edge_uintwide_t_backend(void)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  uint i;
  int iVar7;
  int in_R8D;
  bool bVar8;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  type gcd_uv;
  local_small_uintwide_t_type gcd_max;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  v;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  u;
  uintwide_t_backend<256U,_unsigned_int,_void> local_f8;
  uintwide_t_backend<256U,_unsigned_int,_void> local_d8;
  undefined1 local_b8 [24];
  value_type_conflict avStack_a0 [2];
  uintwide_t_backend<256U,_unsigned_int,_void> local_98;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_70;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_50;
  
  iVar7 = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t<long>
            (&local_98.m_value,0,
             (enable_if_t<(std::is_integral<long>::value_&&_std::is_signed<long>::value)> *)0x0);
  do {
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_50,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_70,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._0_8_ ^
         0xffffffffffffffff;
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._8_8_ ^
         0xffffffffffffffff;
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._16_8_ ^
         0xffffffffffffffff;
    local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
         local_50.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._24_8_ ^
         0xffffffffffffffff;
    lVar6 = 0;
    do {
      piVar1 = (int *)((long)local_d8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar6);
      *piVar1 = *piVar1 + 1;
      if (*piVar1 != 0) break;
      bVar8 = lVar6 != 0x1c;
      lVar6 = lVar6 + 4;
    } while (bVar8);
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._0_8_ ^
         0xffffffffffffffff;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._8_8_ ^
         0xffffffffffffffff;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._16_8_ ^
         0xffffffffffffffff;
    local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
         local_70.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems._24_8_ ^
         0xffffffffffffffff;
    lVar6 = 0;
    do {
      piVar1 = (int *)((long)local_f8.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar6);
      *piVar1 = *piVar1 + 1;
      if (*piVar1 != 0) break;
      bVar8 = lVar6 != 0x1c;
      lVar6 = lVar6 + 4;
    } while (bVar8);
    stack0xffffffffffffff58 = (undefined1  [16])0x0;
    local_b8._0_16_ = (undefined1  [16])0x0;
    boost::multiprecision::default_ops::
    eval_gcd<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>>
              ((uintwide_t_backend<256U,_unsigned_int,_void> *)local_b8,&local_d8,&local_f8);
    auVar5 = stack0xffffffffffffff58;
    auVar4 = local_b8._0_16_;
    lVar6 = 0x1c;
    do {
      if (lVar6 == -4) goto LAB_00117d42;
      uVar3 = *(uint *)((long)local_98.m_value.values.super_array<unsigned_int,_8UL>.elems + lVar6);
      puVar2 = (uint *)(local_b8 + lVar6);
      lVar6 = lVar6 + -4;
    } while (*puVar2 == uVar3);
    if (uVar3 < *puVar2) {
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[4] = local_b8._16_4_;
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[5] = local_b8._20_4_;
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[6] = avStack_a0[0];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[7] = avStack_a0[1];
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[0] = local_b8._0_4_;
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[1] = local_b8._4_4_;
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[2] = local_b8._8_4_;
      local_98.m_value.values.super_array<unsigned_int,_8UL>.elems[3] = local_b8._12_4_;
    }
LAB_00117d42:
    iVar7 = iVar7 + 1;
    local_b8._0_16_ = auVar4;
    unique0x1000056b = auVar5;
    if (iVar7 == 0x40) {
      iVar7 = boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>::
              compare<long,_nullptr>(&local_98,0);
      return iVar7 == 1;
    }
  } while( true );
}

Assistant:

auto test_edge_uintwide_t_backend() -> bool
{
  using local_small_uintwide_t_backend_type = boost::multiprecision::uintwide_t_backend<local_edge_cases::local_digits2_small>;

  using local_small_uintwide_t_type = boost::multiprecision::number<local_small_uintwide_t_backend_type, boost::multiprecision::et_off>;

  auto result_is_ok = true;

  {
    // This odd-looking code is intended to pick up some non-covered lines
    // in the Boost-intended uintwide_t_backend class.

    local_small_uintwide_t_type gcd_max { 0 };

    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(UINT32_C(64));
             ++i)
    {
      const auto u = generate_wide_integer_value<local_small_uintwide_t_type>();
      const auto v = generate_wide_integer_value<local_small_uintwide_t_type>();

      const auto gcd_uv = gcd(-u, -v);

      if(gcd_uv > gcd_max)
      {
        gcd_max = gcd_uv;
      }
    }

    const bool result_gcd_is_ok = (gcd_max > 0);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  return result_is_ok;
}